

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-netlink.c
# Opt level: O2

int rops_pt_init_destroy_netlink
              (lws_context *context,lws_context_creation_info *info,lws_context_per_thread *pt,
              int destroy)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  __pid_t _Var4;
  int iVar5;
  lws_log_cx *plVar6;
  lws *wsi;
  ssize_t sVar7;
  int *piVar8;
  sockaddr local_a8;
  iovec iov;
  undefined8 local_84;
  undefined4 local_7c;
  __pid_t local_78;
  undefined8 local_74;
  undefined4 local_6c;
  msghdr local_68;
  
  if (destroy == 0) {
    iVar3 = 0;
    if ((context->netlink == (lws *)0x0) && (iVar3 = 0, pt <= context->pt)) {
      plVar6 = lwsl_context_get_cx(context);
      _lws_log_cx(plVar6,lws_log_prepend_context,context,8,"rops_pt_init_destroy_netlink",
                  "creating netlink skt");
      wsi = __lws_wsi_create_with_role
                      (context,(int)(((long)pt - (long)context->pt) / 0x1a0),&role_ops_netlink,
                       (lws_log_cx_t *)0x0);
      if (wsi == (lws *)0x0) {
        iVar3 = 1;
      }
      else {
        iVar3 = socket(0x10,3,0);
        (wsi->desc).sockfd = iVar3;
        if (iVar3 == -1) {
          plVar6 = lwsl_context_get_cx(context);
          iVar3 = 1;
          _lws_log_cx(plVar6,lws_log_prepend_context,context,1,"rops_pt_init_destroy_netlink",
                      "unable to open netlink");
        }
        else {
          lws_plat_set_nonblocking(iVar3);
          iVar3 = 0;
          __lws_lc_tag(context,context->lcg + 1,&wsi->lc,"netlink");
          local_a8._0_8_ = (ulong)(uint)local_a8.sa_data._2_4_ << 0x20;
          local_a8.sa_family = 0x10;
          _Var4 = getpid();
          local_a8.sa_data._2_4_ = _Var4;
          local_a8.sa_data[6] = 'Q';
          local_a8.sa_data[7] = '\0';
          local_a8.sa_data[8] = '\0';
          local_a8.sa_data[9] = '\0';
          iVar5 = bind((wsi->desc).sockfd,&local_a8,0xc);
          if (iVar5 < 0) {
            plVar6 = lwsl_context_get_cx(context);
            _lws_log_cx(plVar6,lws_log_prepend_context,context,2,"rops_pt_init_destroy_netlink",
                        "netlink bind failed");
          }
          else {
            context->netlink = wsi;
            iVar3 = lws_wsi_inject_to_loop(pt,wsi);
            if (iVar3 == 0) {
              local_a8.sa_data[6] = '\0';
              local_a8.sa_data[7] = '\0';
              local_a8.sa_data[8] = '\0';
              local_a8.sa_data[9] = '\0';
              local_68.msg_namelen = 0;
              local_68._12_4_ = 0;
              local_68.msg_iov = (iovec *)0x0;
              local_68.msg_iovlen = 0;
              local_68.msg_control = (void *)0x0;
              local_74 = 0;
              local_68.msg_controllen = 0;
              local_68.msg_flags = 0;
              local_68._52_4_ = 0;
              local_6c = 0;
              local_a8.sa_family = 0x10;
              local_a8.sa_data[0] = '\0';
              local_a8.sa_data[1] = '\0';
              local_a8.sa_data[2] = '\0';
              local_a8.sa_data[3] = '\0';
              local_a8.sa_data[4] = '\0';
              local_a8.sa_data[5] = '\0';
              local_84 = 0x301001a0000001c;
              local_7c = 1;
              local_78 = getpid();
              uVar1 = local_74;
              local_74 = CONCAT71(local_74._1_7_,0x11);
              uVar2 = local_74;
              local_74._5_3_ = SUB83(uVar1,5);
              local_74._0_5_ = CONCAT14(0xfd,(int)uVar2);
              local_68.msg_iov = (iovec *)&iov;
              iov.iov_len = 0x1c;
              local_68.msg_iovlen = 1;
              local_68.msg_namelen = 0xc;
              iov.iov_base = &local_84;
              local_68.msg_name = &local_a8;
              sVar7 = sendmsg((wsi->desc).sockfd,&local_68,0);
              if ((int)sVar7 < 0) {
                plVar6 = lwsl_context_get_cx(context);
                piVar8 = __errno_location();
                _lws_log_cx(plVar6,lws_log_prepend_context,context,4,"rops_pt_init_destroy_netlink",
                            "rt dump req failed... permissions? errno %d",*piVar8);
              }
              plVar6 = lwsl_context_get_cx(context);
              _lws_log_cx(plVar6,lws_log_prepend_context,context,0x10,"rops_pt_init_destroy_netlink"
                          ,"starting netlink coldplug wait");
              return 0;
            }
            iVar3 = 1;
          }
          __lws_lc_untag((wsi->a).context,&wsi->lc);
          close((wsi->desc).sockfd);
        }
        lws_realloc(wsi,0,"lws_free");
      }
    }
  }
  else {
    _lws_route_table_empty(pt);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int
rops_pt_init_destroy_netlink(struct lws_context *context,
			     const struct lws_context_creation_info *info,
			     struct lws_context_per_thread *pt, int destroy)
{
	struct sockaddr_nl sanl;
	struct nl_req_s req;
	struct msghdr msg;
	struct iovec iov;
	struct lws *wsi;
	int n, ret = 1;

	if (destroy) {

		/*
		 * pt netlink wsi closed + freed as part of pt's destroy
		 * wsi mass close, just need to take down the routing table
		 */
		_lws_route_table_empty(pt);

		return 0;
	}

	if (context->netlink)
		return 0;

	if (pt > &context->pt[0])
		/* we can only have one netlink socket */
		return 0;

	lwsl_cx_info(context, "creating netlink skt");

	/*
	 * We want a netlink socket per pt as well
	 */

	lws_context_lock(context, __func__);
	wsi = __lws_wsi_create_with_role(context, (int)(pt - &context->pt[0]),
				       &role_ops_netlink, NULL);
	lws_context_unlock(context);
	if (!wsi)
		goto bail;

	wsi->desc.sockfd = socket(AF_NETLINK, SOCK_RAW, NETLINK_ROUTE);
	if (wsi->desc.sockfd == LWS_SOCK_INVALID) {
		lwsl_cx_err(context, "unable to open netlink");
		goto bail1;
	}

	lws_plat_set_nonblocking(wsi->desc.sockfd);

	__lws_lc_tag(context, &context->lcg[LWSLCG_VHOST], &wsi->lc,
			"netlink");

	memset(&sanl, 0, sizeof(sanl));
	sanl.nl_family		= AF_NETLINK;
	sanl.nl_pid		= (uint32_t)getpid();
	sanl.nl_groups		= (1 << (RTNLGRP_LINK - 1)) |
				  (1 << (RTNLGRP_IPV4_ROUTE - 1)) |
				  (1 << (RTNLGRP_IPV4_IFADDR - 1))
#if defined(LWS_WITH_IPV6)
				  | (1 << (RTNLGRP_IPV6_ROUTE - 1)) |
				    (1 << (RTNLGRP_IPV6_IFADDR - 1))
#endif
				 ;

	if (lws_fi(&context->fic, "netlink_bind") ||
	    bind(wsi->desc.sockfd, (struct sockaddr*)&sanl, sizeof(sanl)) < 0) {
		lwsl_cx_warn(context, "netlink bind failed");
		ret = 0; /* some systems deny access, just ignore */
		goto bail2;
	}

	context->netlink = wsi;
	if (lws_wsi_inject_to_loop(pt, wsi))
		goto bail2;

/*	if (lws_change_pollfd(wsi, 0, LWS_POLLIN)) {
		lwsl_err("%s: pollfd in fail\n", __func__);
		goto bail2;
	}
*/
	/*
	 * Since we're starting the PT, ask to be sent all the existing routes.
	 *
	 * This requires CAP_ADMIN, or root... we do this early before dropping
	 * privs
	 */

	memset(&sanl, 0, sizeof(sanl));
	memset(&msg, 0, sizeof(msg));
	memset(&req, 0, sizeof(req));

	sanl.nl_family		= AF_NETLINK;

	req.hdr.nlmsg_len	= NLMSG_LENGTH(sizeof(req.gen));
	req.hdr.nlmsg_type	= RTM_GETROUTE;
	req.hdr.nlmsg_flags	= NLM_F_REQUEST | NLM_F_DUMP;
	req.hdr.nlmsg_seq	= 1;
	req.hdr.nlmsg_pid	= (uint32_t)getpid();
	req.gen.rtm_family	= AF_PACKET;
	req.gen.rtm_table	= RT_TABLE_DEFAULT;

	iov.iov_base		= &req;
	iov.iov_len		= req.hdr.nlmsg_len;
	msg.msg_iov		= &iov;
	msg.msg_iovlen		= 1;
	msg.msg_name		= &sanl;
	msg.msg_namelen		= sizeof(sanl);

	n = (int)sendmsg(wsi->desc.sockfd, (struct msghdr *)&msg, 0);
	if (n < 0) {
		lwsl_cx_notice(context, "rt dump req failed... permissions? errno %d",
				LWS_ERRNO);
	}

	/*
	 * Responses are going to come asynchronously, let's block moving
	 * off state IFACE_COLDPLUG until we have had them.  This is important
	 * since if we don't hold there, when we do get the responses we may
	 * cull any ongoing connections as unroutable otherwise
	 */

	lwsl_cx_debug(context, "starting netlink coldplug wait");

	return 0;

bail2:
	__lws_lc_untag(wsi->a.context, &wsi->lc);
	compatible_close(wsi->desc.sockfd);
bail1:
	lws_free(wsi);
bail:
	return ret;
}